

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteString(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  xmlLinkPtr lk_00;
  void *pvVar2;
  xmlChar *local_40;
  xmlChar *buf;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *content_local;
  xmlTextWriterPtr writer_local;
  
  if ((writer == (xmlTextWriterPtr)0x0) || (content == (xmlChar *)0x0)) {
    return -1;
  }
  lk._0_4_ = 0;
  lk_00 = xmlListFront(writer->nodes);
  local_40 = content;
  if ((lk_00 == (xmlLinkPtr)0x0) || (pvVar2 = xmlLinkGetData(lk_00), pvVar2 == (void *)0x0))
  goto LAB_002180e5;
  iVar1 = *(int *)((long)pvVar2 + 8);
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      local_40 = (xmlChar *)0x0;
      xmlBufAttrSerializeTxtContent(writer->out,writer->doc,content);
      goto LAB_002180e5;
    }
    if (iVar1 != 3) goto LAB_002180e5;
  }
  local_40 = xmlEncodeSpecialChars((xmlDoc *)0x0,content);
LAB_002180e5:
  if (local_40 != (xmlChar *)0x0) {
    lk._0_4_ = xmlTextWriterWriteRaw(writer,local_40);
    if (local_40 != content) {
      (*xmlFree)(local_40);
    }
    if ((int)lk < 0) {
      return -1;
    }
  }
  return (int)lk;
}

Assistant:

int
xmlTextWriterWriteString(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;
    xmlChar *buf;

    if ((writer == NULL) || (content == NULL))
        return -1;

    sum = 0;
    buf = (xmlChar *) content;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_NAME:
                case XML_TEXTWRITER_TEXT:
                    /*
                     * TODO: Use xmlSerializeText
                     */
                    buf = xmlEncodeSpecialChars(NULL, content);
                    break;
                case XML_TEXTWRITER_ATTRIBUTE:
                    buf = NULL;
                    xmlBufAttrSerializeTxtContent(writer->out, writer->doc,
                                                  content);
                    break;
		default:
		    break;
            }
        }
    }

    if (buf != NULL) {
        count = xmlTextWriterWriteRaw(writer, buf);

        if (buf != content)     /* buf was allocated by us, so free it */
            xmlFree(buf);

        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}